

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setCurrentSection(QDateTimeEdit *this,Section section)

{
  QDateTimeEditPrivate *this_00;
  QLineEdit *this_01;
  bool bVar1;
  Section s;
  Section SVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((section != NoSection) &&
     (this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8,
     ((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
      super_QFlagsStorage<QDateTimeEdit::Section>.i & section) != NoSection)) {
    (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (&local_50,this_00);
    QDateTimeEditPrivate::updateCache
              (this_00,&(this_00->super_QAbstractSpinBoxPrivate).value,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar5 = (int)this_00 + 0x3d8;
    iVar3 = *(int *)&this_00->field_0x418;
    iVar4 = *(int *)&this_00->field_0x3e0 + 1;
    bVar1 = true;
    do {
      bVar6 = bVar1;
      if (iVar4 < iVar3) {
        do {
          s = QDateTimeParser::sectionType(iVar5);
          SVar2 = QDateTimeEditPrivate::convertToPublic(s);
          if (SVar2 == section) {
            this_01 = (this_00->super_QAbstractSpinBoxPrivate).edit;
            iVar3 = QDateTimeParser::sectionPos(iVar5);
            QLineEdit::setCursorPosition(this_01,iVar3);
            goto LAB_003e45d6;
          }
          iVar4 = iVar4 + 1;
        } while (iVar3 != iVar4);
      }
      iVar4 = 0;
      bVar1 = false;
    } while (bVar6);
  }
LAB_003e45d6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setCurrentSection(Section section)
{
    Q_D(QDateTimeEdit);
    if (section == NoSection || !(section & d->sections))
        return;

    d->updateCache(d->value, d->displayText());
    const int size = d->sectionNodes.size();
    int index = d->currentSectionIndex + 1;
    for (int i=0; i<2; ++i) {
        while (index < size) {
            if (QDateTimeEditPrivate::convertToPublic(d->sectionType(index)) == section) {
                d->edit->setCursorPosition(d->sectionPos(index));
                QDTEDEBUG << d->sectionPos(index);
                return;
            }
            ++index;
        }
        index = 0;
    }
}